

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

pair<CMutableTransaction,_long> * __thiscall
TestChain100Setup::CreateValidTransaction
          (TestChain100Setup *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *input_transactions,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int input_height
          ,vector<CKey,_std::allocator<CKey>_> *input_signing_keys,
          vector<CTxOut,_std::allocator<CTxOut>_> *outputs,optional<CFeeRate> *feerate,
          optional<unsigned_int> *fee_output)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  size_type sVar7;
  CTransaction *this_00;
  CAmount CVar8;
  reference pvVar9;
  SigningProvider *in_RCX;
  CMutableTransaction *in_RDX;
  pair<CMutableTransaction,_long> *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_COutPoint,_Coin>_>,_bool> pVar10;
  CAmount deduction;
  CAmount target_fee;
  int nHashType;
  COutPoint *outpoint_to_spend;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range1_3;
  CAmount inputs_amount;
  shared_ptr<const_CTransaction> *input_transaction;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range1_2;
  CKey *input_signing_key;
  vector<CKey,_std::allocator<CKey>_> *__range1_1;
  COutPoint *outpoint;
  vector<COutPoint,_std::allocator<COutPoint>_> *__range1;
  CAmount current_fee;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  CCoinsView coins_view;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  CMutableTransaction mempool_txn;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  input_errors;
  Coin utxo_to_spend;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  input_coins;
  CCoinsViewCache coins_cache;
  FillableSigningProvider keystore;
  CCoinsViewCache *in_stack_fffffffffffffa08;
  value_type *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  COutPoint *in_stack_fffffffffffffa20;
  uint32_t num_bytes;
  CCoinsViewCache *in_stack_fffffffffffffa28;
  FillableSigningProvider *in_stack_fffffffffffffa30;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_fffffffffffffa38;
  CMutableTransaction *in_stack_fffffffffffffa40;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_fffffffffffffa48;
  undefined1 deterministic;
  CCoinsView *in_stack_fffffffffffffa50;
  CCoinsViewCache *in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  CTransaction *in_stack_fffffffffffffa68;
  CCoinsViewCache *in_stack_fffffffffffffa70;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_fffffffffffffaa0;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_01;
  long local_4f8;
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
  *in_stack_fffffffffffffb48;
  int nHashType_00;
  undefined4 in_stack_fffffffffffffb58;
  vector<CTxOut,_std::allocator<CTxOut>_> local_418;
  _Base_ptr local_3f8;
  undefined1 local_3f0;
  value_type local_368;
  long local_2e0;
  vector<CTxOut,_std::allocator<CTxOut>_> local_28;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffa08);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::size
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffa08);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::reserve
            (in_stack_fffffffffffffa48,(size_type)in_stack_fffffffffffffa40);
  this_01 = &local_418;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::size
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa08);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::reserve
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa48,
             (size_type)in_stack_fffffffffffffa40);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffa10);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::end
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffa10);
  while (bVar1 = __gnu_cxx::
                 operator==<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                           ((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                            (__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                             *)in_stack_fffffffffffffa10), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator*((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
               *)in_stack_fffffffffffffa08);
    local_28.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uStack_10 = 0;
    local_28.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_28.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    in_stack_fffffffffffffaa0 = &local_28;
    CScript::CScript((CScript *)in_stack_fffffffffffffa08);
    std::vector<CTxIn,std::allocator<CTxIn>>::
    emplace_back<COutPoint_const&,CScript,unsigned_int_const&>
              (in_stack_fffffffffffffa38,(COutPoint *)in_stack_fffffffffffffa30,
               (CScript *)in_stack_fffffffffffffa28,(uint *)in_stack_fffffffffffffa20);
    CScript::~CScript((CScript *)in_stack_fffffffffffffa08);
    __gnu_cxx::
    __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_fffffffffffffa08);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=(this_01,in_stack_fffffffffffffaa0);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffffa08);
  std::vector<CKey,_std::allocator<CKey>_>::begin
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_fffffffffffffa10);
  std::vector<CKey,_std::allocator<CKey>_>::end
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_fffffffffffffa10);
  while( true ) {
    bVar1 = __gnu_cxx::operator==<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>
                      ((__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *
                       )CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                       (__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *
                       )in_stack_fffffffffffffa10);
    deterministic = (undefined1)((ulong)in_stack_fffffffffffffa48 >> 0x38);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>::operator*
              ((__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)
               in_stack_fffffffffffffa08);
    FillableSigningProvider::AddKey(in_stack_fffffffffffffa30,(CKey *)in_stack_fffffffffffffa28);
    __gnu_cxx::__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>::
    operator++((__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)
               in_stack_fffffffffffffa08);
  }
  CCoinsView::CCoinsView((CCoinsView *)in_stack_fffffffffffffa08);
  CCoinsViewCache::CCoinsViewCache
            (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,(bool)deterministic);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_fffffffffffffa10);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         *)in_stack_fffffffffffffa10);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                           ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                            (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                             *)in_stack_fffffffffffffa10), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                 *)in_stack_fffffffffffffa08);
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffa08);
    AddCoins(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
             (int)((ulong)in_stack_fffffffffffffa60 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffa60 >> 0x18,0));
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                  *)in_stack_fffffffffffffa08);
  }
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
       *)in_stack_fffffffffffffa08);
  local_4f8 = 0;
  std::vector<COutPoint,_std::allocator<COutPoint>_>::begin
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffa10);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::end
            ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_fffffffffffffa10);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                      ((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                        *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                       (__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                        *)in_stack_fffffffffffffa10);
    nHashType_00 = (int)((ulong)in_R9 >> 0x20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator*((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
               *)in_stack_fffffffffffffa08);
    Coin::Coin((Coin *)in_stack_fffffffffffffa08);
    bVar1 = CCoinsViewCache::GetCoin
                      (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,
                       (Coin *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    if (!bVar1) {
      __assert_fail("coins_cache.GetCoin(outpoint_to_spend, utxo_to_spend)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1b5,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    std::pair<const_COutPoint,_Coin>::pair<Coin_&,_true>
              ((pair<const_COutPoint,_Coin> *)
               CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
               &in_stack_fffffffffffffa10->first,(Coin *)in_stack_fffffffffffffa08);
    pVar10 = std::
             map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
             ::insert((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                       *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                      in_stack_fffffffffffffa10);
    local_3f8 = (_Base_ptr)pVar10.first._M_node;
    local_3f0 = pVar10.second;
    std::pair<const_COutPoint,_Coin>::~pair
              ((pair<const_COutPoint,_Coin> *)in_stack_fffffffffffffa08);
    local_4f8 = local_2e0 + local_4f8;
    Coin::~Coin((Coin *)in_stack_fffffffffffffa08);
    __gnu_cxx::
    __normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>::
    operator++((__normal_iterator<const_COutPoint_*,_std::vector<COutPoint,_std::allocator<COutPoint>_>_>
                *)in_stack_fffffffffffffa08);
  }
  std::
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>::
  map((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
       *)in_stack_fffffffffffffa08);
  num_bytes = (uint32_t)((ulong)in_stack_fffffffffffffa20 >> 0x20);
  bVar1 = SignTransaction(in_RDX,in_RCX,
                          (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                           *)CONCAT44(in_R8D,in_stack_fffffffffffffb58),nHashType_00,
                          in_stack_fffffffffffffb48);
  if (!bVar1) {
    __assert_fail("SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                  ,0x1bc,
                  "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                 );
  }
  cVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa10);
  cVar3 = std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa10);
  lVar4 = std::
          accumulate<__gnu_cxx::__normal_iterator<CTxOut_const*,std::vector<CTxOut,std::allocator<CTxOut>>>,long,TestChain100Setup::CreateValidTransaction(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&,std::vector<COutPoint,std::allocator<COutPoint>>const&,int,std::vector<CKey,std::allocator<CKey>>const&,std::vector<CTxOut,std::allocator<CTxOut>>const&,std::optional<CFeeRate>const&,std::optional<unsigned_int>const&)::__0>
                    (cVar2._M_current,cVar3._M_current,0);
  bVar1 = std::optional<CFeeRate>::has_value((optional<CFeeRate> *)in_stack_fffffffffffffa08);
  if (bVar1) {
    bVar1 = std::optional<unsigned_int>::has_value
                      ((optional<unsigned_int> *)in_stack_fffffffffffffa08);
    if (!bVar1) {
      __assert_fail("fee_output.has_value()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1c3,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    puVar5 = std::optional<unsigned_int>::value
                       ((optional<unsigned_int> *)
                        CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    uVar6 = (ulong)*puVar5;
    sVar7 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffa08);
    if (sVar7 <= uVar6) {
      __assert_fail("fee_output.value() < mempool_txn.vout.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1c4,
                    "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                   );
    }
    this_00 = (CTransaction *)
              std::optional<CFeeRate>::value
                        ((optional<CFeeRate> *)
                         CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
    CTransaction::CTransaction(this_00,in_stack_fffffffffffffa40);
    GetVirtualTransactionSize((CTransaction *)in_stack_fffffffffffffa08);
    CVar8 = CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffa28,num_bytes);
    CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffffa08);
    lVar4 = CVar8 - (local_4f8 - lVar4);
    if (0 < lVar4) {
      std::optional<unsigned_int>::value
                ((optional<unsigned_int> *)
                 CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18));
      pvVar9 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                         ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                          CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                          (size_type)in_stack_fffffffffffffa10);
      pvVar9->nValue = pvVar9->nValue - lVar4;
      in_stack_fffffffffffffa10 = &local_368;
      std::
      map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
      ::clear((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
               *)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa1f =
           SignTransaction(in_RDX,in_RCX,
                           (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                            *)CONCAT44(in_R8D,in_stack_fffffffffffffb58),nHashType_00,
                           in_stack_fffffffffffffb48);
      if (!(bool)in_stack_fffffffffffffa1f) {
        __assert_fail("SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                      ,0x1cd,
                      "std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, const std::optional<CFeeRate> &, const std::optional<uint32_t> &)"
                     );
      }
    }
  }
  std::pair<CMutableTransaction,_long>::pair<CMutableTransaction_&,_long_&,_true>
            ((pair<CMutableTransaction,_long> *)
             CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
             (CMutableTransaction *)in_stack_fffffffffffffa10,(long *)in_stack_fffffffffffffa08);
  std::
  map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>::
  ~map((map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
        *)in_stack_fffffffffffffa08);
  std::
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
  ~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        *)in_stack_fffffffffffffa08);
  CCoinsViewCache::~CCoinsViewCache(in_stack_fffffffffffffa08);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffffa08);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffffa08);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::pair<CMutableTransaction, CAmount> TestChain100Setup::CreateValidTransaction(const std::vector<CTransactionRef>& input_transactions,
                                                                                  const std::vector<COutPoint>& inputs,
                                                                                  int input_height,
                                                                                  const std::vector<CKey>& input_signing_keys,
                                                                                  const std::vector<CTxOut>& outputs,
                                                                                  const std::optional<CFeeRate>& feerate,
                                                                                  const std::optional<uint32_t>& fee_output)
{
    CMutableTransaction mempool_txn;
    mempool_txn.vin.reserve(inputs.size());
    mempool_txn.vout.reserve(outputs.size());

    for (const auto& outpoint : inputs) {
        mempool_txn.vin.emplace_back(outpoint, CScript(), MAX_BIP125_RBF_SEQUENCE);
    }
    mempool_txn.vout = outputs;

    // - Add the signing key to a keystore
    FillableSigningProvider keystore;
    for (const auto& input_signing_key : input_signing_keys) {
        keystore.AddKey(input_signing_key);
    }
    // - Populate a CoinsViewCache with the unspent output
    CCoinsView coins_view;
    CCoinsViewCache coins_cache(&coins_view);
    for (const auto& input_transaction : input_transactions) {
        AddCoins(coins_cache, *input_transaction.get(), input_height);
    }
    // Build Outpoint to Coin map for SignTransaction
    std::map<COutPoint, Coin> input_coins;
    CAmount inputs_amount{0};
    for (const auto& outpoint_to_spend : inputs) {
        // - Use GetCoin to properly populate utxo_to_spend,
        Coin utxo_to_spend;
        assert(coins_cache.GetCoin(outpoint_to_spend, utxo_to_spend));
        input_coins.insert({outpoint_to_spend, utxo_to_spend});
        inputs_amount += utxo_to_spend.out.nValue;
    }
    // - Default signature hashing type
    int nHashType = SIGHASH_ALL;
    std::map<int, bilingual_str> input_errors;
    assert(SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors));
    CAmount current_fee = inputs_amount - std::accumulate(outputs.begin(), outputs.end(), CAmount(0),
        [](const CAmount& acc, const CTxOut& out) {
        return acc + out.nValue;
    });
    // Deduct fees from fee_output to meet feerate if set
    if (feerate.has_value()) {
        assert(fee_output.has_value());
        assert(fee_output.value() < mempool_txn.vout.size());
        CAmount target_fee = feerate.value().GetFee(GetVirtualTransactionSize(CTransaction{mempool_txn}));
        CAmount deduction = target_fee - current_fee;
        if (deduction > 0) {
            // Only deduct fee if there's anything to deduct. If the caller has put more fees than
            // the target feerate, don't change the fee.
            mempool_txn.vout[fee_output.value()].nValue -= deduction;
            // Re-sign since an output has changed
            input_errors.clear();
            assert(SignTransaction(mempool_txn, &keystore, input_coins, nHashType, input_errors));
            current_fee = target_fee;
        }
    }
    return {mempool_txn, current_fee};
}